

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.periodic.c
# Opt level: O0

void pnga_periodic(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                  Integer op_code)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_R8;
  Integer *in_stack_00000008;
  int get_range;
  Integer hip [7];
  Integer lop [7];
  Integer temp_offset;
  Integer my_offset;
  Integer offset [7] [3];
  Integer range_num [7];
  Integer range [7] [6];
  Integer dims [7];
  Integer ndim;
  Integer type;
  int done;
  int counter [7];
  int j;
  int i;
  long *alpha_00;
  Integer *ld_00;
  void *in_stack_fffffffffffffc68;
  Integer *in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  undefined8 local_378 [8];
  undefined8 local_338 [8];
  long local_2f8;
  long local_2f0;
  long local_2e8 [22];
  long local_238 [6];
  Integer in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  undefined8 local_1f8;
  Integer *in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  Integer *in_stack_fffffffffffffe20;
  Integer *in_stack_fffffffffffffe28;
  Integer in_stack_fffffffffffffe30;
  Integer *in_stack_fffffffffffffe68;
  Integer *in_stack_fffffffffffffe70;
  Integer (*in_stack_fffffffffffffe78) [6];
  Integer *in_stack_fffffffffffffe80;
  Integer *in_stack_fffffffffffffe88;
  Integer *in_stack_fffffffffffffe90;
  Integer in_stack_fffffffffffffe98;
  Integer (*in_stack_fffffffffffffeb0) [3];
  Integer in_stack_fffffffffffffeb8;
  long local_70;
  int local_58 [8];
  int local_38;
  int local_34;
  long local_28;
  
  local_28 = in_R8;
  pnga_inquire((Integer)in_stack_fffffffffffffe80,*in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  alpha_00 = local_2e8;
  ld_00 = in_stack_00000008;
  iVar3 = ngai_peri_get_range_
                    (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  if (iVar3 == 0) {
    pnga_error(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  if (iVar3 == 100) {
    if (in_stack_00000008 == (Integer *)0x1) {
      pnga_get(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    }
    else if (in_stack_00000008 == (Integer *)0x2) {
      pnga_put(CONCAT44(100,in_stack_fffffffffffffc80),(Integer *)0x2,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,ld_00);
    }
    else if (in_stack_00000008 == (Integer *)0x3) {
      pnga_acc(CONCAT44(100,in_stack_fffffffffffffc80),(Integer *)0x3,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,ld_00,alpha_00);
    }
    else {
      pnga_error(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
  }
  else {
    for (local_34 = 0; local_34 < local_70; local_34 = local_34 + 1) {
      local_58[local_34] = 0;
    }
    bVar2 = false;
    do {
      local_2f0 = 0;
      for (local_34 = 0; local_34 < local_70; local_34 = local_34 + 1) {
        local_338[local_34] = (&local_1f8)[(long)local_34 * 6 + (long)(local_58[local_34] << 1)];
        local_378[local_34] = (&local_1f8)[(long)local_34 * 6 + (long)(local_58[local_34] * 2 + 1)];
        if (local_34 == 0) {
          lVar1 = local_238[(long)local_58[0] + -0x16];
        }
        else {
          local_2f8 = local_2e8[(long)local_34 * 3 + (long)local_58[local_34]];
          for (local_38 = 0; lVar1 = local_2f8, local_38 < local_34; local_38 = local_38 + 1) {
            local_2f8 = *(long *)(local_28 + (long)local_38 * 8) * local_2f8;
          }
        }
        local_2f0 = lVar1 + local_2f0;
      }
      if (in_stack_00000008 == (Integer *)0x1) {
        pnga_get(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      }
      else if (in_stack_00000008 == (Integer *)0x2) {
        pnga_put(CONCAT44(iVar3,in_stack_fffffffffffffc80),in_stack_fffffffffffffc78,(Integer *)0x2,
                 in_stack_fffffffffffffc68,ld_00);
      }
      else if (in_stack_00000008 == (Integer *)0x3) {
        pnga_acc(CONCAT44(iVar3,in_stack_fffffffffffffc80),in_stack_fffffffffffffc78,(Integer *)0x3,
                 in_stack_fffffffffffffc68,ld_00,alpha_00);
      }
      else {
        pnga_error(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
      local_58[0] = local_58[0] + 1;
      for (local_34 = 0; local_34 < local_70; local_34 = local_34 + 1) {
        if ((long)local_58[local_34] == local_238[local_34]) {
          local_58[local_34] = 0;
          if ((long)local_34 == local_70 + -1) {
            bVar2 = true;
            break;
          }
          local_58[local_34 + 1] = local_58[local_34 + 1] + 1;
        }
      }
    } while (!bVar2);
  }
  return;
}

Assistant:

void pnga_periodic(Integer g_a, Integer *lo, Integer *hi, void *buf,
                    Integer *ld, void *alpha, Integer op_code)
{
    int i, j, counter[MAXDIM], done;
    Integer type, ndim, dims[MAXDIM];
    Integer range[MAXDIM][RANGE_BOUND], range_num[MAXDIM];
    Integer offset[MAXDIM][RANGE_BOUND/2], my_offset, temp_offset;
    Integer lop[MAXDIM], hip[MAXDIM];
    int get_range;
    
    pnga_inquire(g_a, &type, &ndim, dims);

    get_range = ngai_peri_get_range_(ndim, dims, lo, hi, range, range_num,
                                     offset, op_code);
    
    if(!get_range) pnga_error("g_a indices are invalid ", 0L);

    /* If this is a regular patch, not periodic operation needed */
    if(get_range == IS_REGULAR_PATCH) {
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lo, hi, buf, ld);
              break;
          case PERIODIC_ACC:    
              pnga_acc(g_a, lo, hi, buf, ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }
        return;
    }

    /* periodic operation continues */
    for(i=0; i<ndim; i++) counter[i] = 0;

    done = 0;
    do {
        my_offset = 0;
        
        for(i=0; i<ndim; i++) {
            lop[i] = range[i][counter[i]*2];
            hip[i] = range[i][counter[i]*2+1];

            /* calculate the offset */
            if(i == 0) my_offset += offset[i][counter[i]];
            else {
                temp_offset = offset[i][counter[i]];
                for(j=0; j<i; j++)
                    /* temp_offset *= dims[j]; */
                    temp_offset *= ld[j];
                my_offset += temp_offset;
            }
        }
        
        /* deal with this patch */
        switch(op_code) {
          case PERIODIC_GET:
              pnga_get(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_PUT:
              pnga_put(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld);
              break;
          case PERIODIC_ACC:
              pnga_acc(g_a, lop, hip,
                       (char *)buf+my_offset*GAsizeofM(type), ld, alpha);
              break;
          default:
              pnga_error("This operation is invalid ", 0L);
        }      

        counter[0]++;
        for(i=0; i<ndim; i++) {
            if(counter[i] == range_num[i]) {
                counter[i] = 0;
                if(i == (ndim-1)) { done = 1; break; }
                else counter[i+1]++;
            }
        }
    } while(!done);
}